

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

CURLcode Curl_conn_flush(Curl_easy *data,int sockindex)

{
  Curl_cft_cntrl *pCVar1;
  CURLcode CVar2;
  Curl_cfilter *pCVar3;
  
  pCVar3 = data->conn->cfilter[sockindex];
  if (pCVar3 == (Curl_cfilter *)0x0) {
    CVar2 = CURLE_OK;
  }
  else {
    CVar2 = CURLE_OK;
    do {
      pCVar1 = pCVar3->cft->cntrl;
      if ((pCVar1 != Curl_cf_def_cntrl) &&
         (CVar2 = (*pCVar1)(pCVar3,data,0x102,0,(void *)0x0), CVar2 != CURLE_OK)) {
        return CVar2;
      }
      pCVar3 = pCVar3->next;
    } while (pCVar3 != (Curl_cfilter *)0x0);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_conn_flush(struct Curl_easy *data, int sockindex)
{
  return Curl_conn_cf_cntrl(data->conn->cfilter[sockindex], data, FALSE,
                            CF_CTRL_FLUSH, 0, NULL);
}